

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:308:65)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:308:65)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  pointer pvVar1;
  void *pvVar2;
  long *plVar3;
  void *pvVar4;
  bool bVar5;
  object_ptr v;
  object_ptr o;
  undefined1 local_60 [32];
  gc_heap_ptr_untyped **local_40;
  uint32_t local_38;
  
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pvVar1 != (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                 super__Vector_impl_data._M_finish) && (pvVar1->type_ == object)) {
    if (pvVar1->type_ != object) {
      __assert_fail("type_ == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",
                    0x46,"const object_ptr &mjs::value::object_value() const");
    }
    pvVar2 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(pvVar1->field_1).s_);
    if (*(int *)((long)pvVar2 + 0x14) == 0) {
      local_60._0_8_ = (gc_heap *)0x0;
      local_60._8_4_ = 0;
    }
    else {
      gc_heap::unsafe_create_from_position<mjs::object>
                ((gc_heap *)local_60,(uint32_t)*(undefined8 *)((long)pvVar2 + 8));
    }
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
    (**(code **)(*plVar3 + 0x88))(local_60 + 0x10,plVar3,this_);
    if ((gc_heap *)local_60._0_8_ != (gc_heap *)0x0) {
      bVar5 = false;
      do {
        pvVar2 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_60 + 0x10));
        pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_60);
        if (pvVar2 == pvVar4) {
          __return_storage_ptr__->type_ = boolean;
          (__return_storage_ptr__->field_1).b_ = true;
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_60 + 0x10));
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_60);
          if (!bVar5) {
            return __return_storage_ptr__;
          }
          goto LAB_0015977f;
        }
        pvVar2 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_60);
        if (*(int *)((long)pvVar2 + 0x14) == 0) {
          local_40 = (gc_heap_ptr_untyped **)0x0;
          local_38 = 0;
        }
        else {
          gc_heap::unsafe_create_from_position<mjs::object>
                    ((gc_heap *)&stack0xffffffffffffffc0,(uint32_t)*(undefined8 *)((long)pvVar2 + 8)
                    );
        }
        gc_heap_ptr_untyped::operator=
                  ((gc_heap_ptr_untyped *)local_60,(gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
        bVar5 = (gc_heap *)local_60._0_8_ == (gc_heap *)0x0;
      } while (!bVar5);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_60 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_60);
  }
LAB_0015977f:
  __return_storage_ptr__->type_ = boolean;
  (__return_storage_ptr__->field_1).b_ = false;
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }